

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corruption_test.cc
# Opt level: O0

void __thiscall
leveldb::CorruptionTest_TableFile_Test::TestBody(CorruptionTest_TableFile_Test *this)

{
  DBImpl *local_18;
  DBImpl *dbi;
  CorruptionTest_TableFile_Test *this_local;
  
  dbi = (DBImpl *)this;
  CorruptionTest::Build(&this->super_CorruptionTest,100);
  local_18 = (DBImpl *)(this->super_CorruptionTest).db_;
  DBImpl::TEST_CompactMemTable((DBImpl *)&stack0xffffffffffffffe0);
  Status::~Status((Status *)&stack0xffffffffffffffe0);
  DBImpl::TEST_CompactRange(local_18,0,(Slice *)0x0,(Slice *)0x0);
  DBImpl::TEST_CompactRange(local_18,1,(Slice *)0x0,(Slice *)0x0);
  CorruptionTest::Corrupt(&this->super_CorruptionTest,kTableFile,100,1);
  CorruptionTest::Check(&this->super_CorruptionTest,0x5a,99);
  return;
}

Assistant:

TEST_F(CorruptionTest, TableFile) {
  Build(100);
  DBImpl* dbi = reinterpret_cast<DBImpl*>(db_);
  dbi->TEST_CompactMemTable();
  dbi->TEST_CompactRange(0, nullptr, nullptr);
  dbi->TEST_CompactRange(1, nullptr, nullptr);

  Corrupt(kTableFile, 100, 1);
  Check(90, 99);
}